

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_uint * nk_add_value(nk_context *ctx,nk_window *win,nk_hash name,nk_uint value)

{
  uint uVar1;
  nk_table *pnVar2;
  nk_table *tbl;
  nk_uint value_local;
  nk_hash name_local;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3c22,
                  "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)"
                 );
  }
  if (win == (nk_window *)0x0) {
    __assert_fail("win",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3c23,
                  "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)"
                 );
  }
  if ((win == (nk_window *)0x0) || (ctx == (nk_context *)0x0)) {
    ctx_local = (nk_context *)0x0;
  }
  else {
    if ((win->tables == (nk_table *)0x0) || (0x3a < win->tables->size)) {
      pnVar2 = nk_create_table(ctx);
      if (pnVar2 == (nk_table *)0x0) {
        __assert_fail("tbl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                      ,0x3c27,
                      "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)"
                     );
      }
      if (pnVar2 == (nk_table *)0x0) {
        return (nk_uint *)0x0;
      }
      nk_push_table(win,pnVar2);
    }
    win->tables->seq = win->seq;
    win->tables->keys[win->tables->size] = name;
    win->tables->values[win->tables->size] = value;
    pnVar2 = win->tables;
    uVar1 = win->tables->size;
    win->tables->size = uVar1 + 1;
    ctx_local = (nk_context *)(pnVar2->values + uVar1);
  }
  return (nk_uint *)ctx_local;
}

Assistant:

NK_LIB nk_uint*
nk_add_value(struct nk_context *ctx, struct nk_window *win,
            nk_hash name, nk_uint value)
{
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!win || !ctx) return 0;
    if (!win->tables || win->tables->size >= NK_VALUE_PAGE_CAPACITY) {
        struct nk_table *tbl = nk_create_table(ctx);
        NK_ASSERT(tbl);
        if (!tbl) return 0;
        nk_push_table(win, tbl);
    }
    win->tables->seq = win->seq;
    win->tables->keys[win->tables->size] = name;
    win->tables->values[win->tables->size] = value;
    return &win->tables->values[win->tables->size++];
}